

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaNormalTargetGenerator::WriteLanguagesRules(cmNinjaNormalTargetGenerator *this)

{
  bool bVar1;
  cmGeneratorTarget *this_00;
  cmMakefile *this_01;
  char *pcVar2;
  reference ppcVar3;
  ulong uVar4;
  reference language;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar5;
  _Self local_110;
  _Self local_108;
  const_iterator l;
  string local_f0;
  value_type *local_d0;
  string *lang;
  __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  local_c0;
  __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  local_b8;
  const_iterator i;
  string local_a8;
  string local_88;
  undefined1 local_58 [8];
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> sourceFiles;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  languages;
  cmNinjaNormalTargetGenerator *this_local;
  
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&sourceFiles.
            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_58);
  this_00 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  this_01 = cmNinjaTargetGenerator::GetMakefile(&this->super_cmNinjaTargetGenerator);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a8,"CMAKE_BUILD_TYPE",(allocator *)((long)&i._M_current + 7));
  pcVar2 = cmMakefile::GetSafeDefinition(this_01,&local_a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,pcVar2,(allocator *)((long)&i._M_current + 6));
  cmGeneratorTarget::GetObjectSources
            (this_00,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_58
             ,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)((long)&i._M_current + 6));
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&i._M_current + 7));
  local_c0._M_current =
       (cmSourceFile **)
       std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                 ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_58);
  __gnu_cxx::
  __normal_iterator<cmSourceFile_const*const*,std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>
  ::__normal_iterator<cmSourceFile_const**>
            ((__normal_iterator<cmSourceFile_const*const*,std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>
              *)&local_b8,&local_c0);
  while( true ) {
    lang = (string *)
           std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                     ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                      local_58);
    bVar1 = __gnu_cxx::operator!=
                      (&local_b8,
                       (__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                        *)&lang);
    if (!bVar1) break;
    ppcVar3 = __gnu_cxx::
              __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
              ::operator*(&local_b8);
    cmSourceFile::GetLanguage_abi_cxx11_(&local_f0,*ppcVar3);
    local_d0 = &local_f0;
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      pVar5 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&sourceFiles.
                           super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,local_d0);
      l._M_node = (_Base_ptr)pVar5.first._M_node;
    }
    std::__cxx11::string::~string((string *)&local_f0);
    __gnu_cxx::
    __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
    ::operator++(&local_b8);
  }
  local_108._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&sourceFiles.
                   super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
  while( true ) {
    local_110._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&sourceFiles.
                   super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar1 = std::operator!=(&local_108,&local_110);
    if (!bVar1) break;
    language = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_108);
    cmNinjaTargetGenerator::WriteLanguageRules(&this->super_cmNinjaTargetGenerator,language);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_108);
  }
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_58);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&sourceFiles.
             super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteLanguagesRules()
{
#ifdef NINJA_GEN_VERBOSE_FILES
  cmGlobalNinjaGenerator::WriteDivider(this->GetRulesFileStream());
  this->GetRulesFileStream()
    << "# Rules for each languages for "
    << cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType())
    << " target " << this->GetTargetName() << "\n\n";
#endif

  // Write rules for languages compiled in this target.
  std::set<std::string> languages;
  std::vector<cmSourceFile const*> sourceFiles;
  this->GetGeneratorTarget()->GetObjectSources(
    sourceFiles, this->GetMakefile()->GetSafeDefinition("CMAKE_BUILD_TYPE"));
  for (std::vector<cmSourceFile const*>::const_iterator i =
         sourceFiles.begin();
       i != sourceFiles.end(); ++i) {
    const std::string& lang = (*i)->GetLanguage();
    if (!lang.empty()) {
      languages.insert(lang);
    }
  }
  for (std::set<std::string>::const_iterator l = languages.begin();
       l != languages.end(); ++l) {
    this->WriteLanguageRules(*l);
  }
}